

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawColumnRt1ShadedPalCommand::Execute
          (DrawColumnRt1ShadedPalCommand *this,DrawerThread *thread)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  byte *pbVar12;
  
  iVar7 = (this->super_PalRtCommand).yl;
  iVar7 = DrawerThread::count_for_thread(thread,iVar7,((this->super_PalRtCommand).yh - iVar7) + 1);
  if (0 < iVar7) {
    iVar2 = (this->super_PalRtCommand)._color;
    puVar5 = (this->super_PalRtCommand)._colormap;
    iVar3 = (this->super_PalRtCommand).yl;
    iVar8 = DrawerThread::skipped_by_thread(thread,iVar3);
    pbVar12 = (this->super_PalRtCommand)._destorg +
              (long)(this->super_PalRtCommand).sx + (long)(int)(&ylookup)[iVar8 + iVar3];
    puVar6 = thread->dc_temp;
    iVar9 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    iVar3 = *(int *)&(this->super_PalRtCommand).super_DrawerCommand.field_0xc;
    iVar8 = (this->super_PalRtCommand)._pitch;
    iVar4 = thread->num_cores;
    lVar10 = 0;
    do {
      bVar1 = puVar5[puVar6[lVar10 * 4 + (long)(iVar9 * 4 + iVar3)]];
      uVar11 = Col2RGB8[0x40 - bVar1][*pbVar12] + Col2RGB8[bVar1][iVar2] | 0x1f07c1f;
      *pbVar12 = RGB32k.All[uVar11 >> 0xf & uVar11];
      pbVar12 = pbVar12 + (long)iVar4 * (long)iVar8;
      lVar10 = lVar10 + 1;
    } while (iVar7 != (int)lVar10);
  }
  return;
}

Assistant:

void DrawColumnRt1ShadedPalCommand::Execute(DrawerThread *thread)
	{
		uint32_t *fgstart;
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int pitch;

		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		fgstart = &Col2RGB8[0][_color];
		colormap = _colormap;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4 + hx];
		pitch = _pitch * thread->num_cores;

		do {
			uint32_t val = colormap[*source];
			uint32_t fg = fgstart[val<<8];
			val = (Col2RGB8[64-val][*dest] + fg) | 0x1f07c1f;
			*dest = RGB32k.All[val & (val>>15)];
			source += 4;
			dest += pitch;
		} while (--count);
	}